

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O3

void __thiscall DynamicGraphTest::testNonBreakDelete(DynamicGraphTest *this)

{
  DynamicGraph *this_00;
  pointer psVar1;
  bool bVar2;
  unsigned_long uVar3;
  __normal_iterator<const_boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>
  _Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  initializer_list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> __l;
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  expectedVirtualEdges;
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_90;
  undefined8 local_78;
  undefined8 local_70;
  _List_node_base *local_68;
  undefined8 local_60;
  undefined8 local_58;
  _List_node_base *local_50;
  undefined8 local_48;
  undefined8 local_40;
  _List_node_base *local_38;
  
  this_00 = &this->G;
  local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x10;
  local_b8.
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&DAT_00000011;
  bVar2 = DynamicGraph::areConnected(this_00,(Vertex *)&local_90,(Vertex *)&local_b8);
  if (!bVar2) {
    __assert_fail("G.areConnected(16, 17)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x6e,"void DynamicGraphTest::testNonBreakDelete()");
  }
  local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x10;
  local_b8.
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&DAT_00000011;
  DynamicGraph::deleteEdge(this_00,(Vertex *)&local_90,(Vertex *)&local_b8);
  local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x10;
  local_b8.
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&DAT_00000011;
  bVar2 = DynamicGraph::areConnected(this_00,(Vertex *)&local_90,(Vertex *)&local_b8);
  if (!bVar2) {
    __assert_fail("G.areConnected(16, 17)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x71,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0);
  if (uVar3 != 0) {
    __assert_fail("G.getLevel(0)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x74,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,1);
  if (uVar3 != 1) {
    __assert_fail("G.getLevel(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x75,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,2);
  if (uVar3 != 1) {
    __assert_fail("G.getLevel(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x76,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,3);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(3)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x77,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,4);
  if (uVar3 != 1) {
    __assert_fail("G.getLevel(4)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x78,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,5);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x79,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,6);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7a,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,7);
  if (uVar3 != 1) {
    __assert_fail("G.getLevel(7)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7b,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,8);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(8)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7c,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,9);
  if (uVar3 != 1) {
    __assert_fail("G.getLevel(9)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7d,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,10);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(10)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7e,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0xb);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(11)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x7f,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0xc);
  if (uVar3 != 3) {
    __assert_fail("G.getLevel(12)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x80,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0xd);
  if (uVar3 != 3) {
    __assert_fail("G.getLevel(13)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x81,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0xe);
  if (uVar3 != 4) {
    __assert_fail("G.getLevel(14)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x82,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0xf);
  if (uVar3 != 3) {
    __assert_fail("G.getLevel(15)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x83,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0x10);
  if (uVar3 != 1) {
    __assert_fail("G.getLevel(16)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x84,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0x11);
  if (uVar3 != 4) {
    __assert_fail("G.getLevel(17)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x85,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0x12);
  if (uVar3 != 3) {
    __assert_fail("G.getLevel(18)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x86,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getLevel(this_00,0x13);
  if (uVar3 != 2) {
    __assert_fail("G.getLevel(19)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x87,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,0);
  if (uVar3 != 1) {
    __assert_fail("G.getComponent(0)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8a,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,1);
  if (uVar3 != 1) {
    __assert_fail("G.getComponent(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8b,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,2);
  if (uVar3 != 1) {
    __assert_fail("G.getComponent(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8c,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,3);
  if (uVar3 != 1) {
    __assert_fail("G.getComponent(3)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8d,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,4);
  if (uVar3 != 2) {
    __assert_fail("G.getComponent(4)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8e,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,5);
  if (uVar3 != 2) {
    __assert_fail("G.getComponent(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x8f,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,6);
  if (uVar3 != 2) {
    __assert_fail("G.getComponent(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x90,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,9);
  if (uVar3 != 4) {
    __assert_fail("G.getComponent(9)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x91,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,10);
  if (uVar3 != 4) {
    __assert_fail("G.getComponent(10)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x92,"void DynamicGraphTest::testNonBreakDelete()");
  }
  uVar3 = DynamicGraph::getComponent(this_00,0xb);
  if (uVar3 == 4) {
    uVar3 = DynamicGraph::getComponent(this_00,0xc);
    if (uVar3 != 4) {
      __assert_fail("G.getComponent(12)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x94,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0xd);
    if (uVar3 != 4) {
      __assert_fail("G.getComponent(13)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x95,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0xe);
    if (uVar3 != 4) {
      __assert_fail("G.getComponent(14)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x96,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0xf);
    if (uVar3 != 4) {
      __assert_fail("G.getComponent(15)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x97,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0x10);
    if (uVar3 != 5) {
      __assert_fail("G.getComponent(16)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x98,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0x11);
    if (uVar3 != 5) {
      __assert_fail("G.getComponent(17)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x99,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0x12);
    if (uVar3 != 5) {
      __assert_fail("G.getComponent(18)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x9a,"void DynamicGraphTest::testNonBreakDelete()");
    }
    uVar3 = DynamicGraph::getComponent(this_00,0x13);
    if (uVar3 == 5) {
      psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 4;
      local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = 0;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                        (*(undefined8 *)
                          &(psVar1->super_StoredVertex).m_out_edges.
                           super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         ,*(pointer *)
                           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                           + 8));
      if (_Var4._M_current ==
          *(pointer *)
           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
           + 8)) {
        local_90.m_eproperty = (_List_node_base *)0x0;
      }
      else {
        local_90.m_eproperty = ((_Var4._M_current)->m_iter)._M_node + 2;
      }
      p_Var5 = (_List_node_base *)0x0;
      local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0;
      local_90.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = 4;
      psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a0 = 7;
      local_98 = 0;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                        (*(undefined8 *)
                          &(psVar1->super_StoredVertex).m_out_edges.
                           super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         ,*(pointer *)
                           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                           + 8));
      if (_Var4._M_current !=
          *(pointer *)
           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
           + 8)) {
        p_Var5 = ((_Var4._M_current)->m_iter)._M_node + 2;
      }
      p_Var6 = (_List_node_base *)0x0;
      local_78 = 0;
      local_70 = 7;
      psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a0 = 9;
      local_98 = 0;
      local_68 = p_Var5;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                        (*(undefined8 *)
                          &(psVar1->super_StoredVertex).m_out_edges.
                           super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         ,*(pointer *)
                           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                           + 8));
      if (_Var4._M_current !=
          *(pointer *)
           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
           + 8)) {
        p_Var6 = ((_Var4._M_current)->m_iter)._M_node + 2;
      }
      p_Var5 = (_List_node_base *)0x0;
      local_60 = 0;
      local_58 = 9;
      psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a0 = 0x10;
      local_98 = 0;
      local_50 = p_Var6;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                        (*(undefined8 *)
                          &(psVar1->super_StoredVertex).m_out_edges.
                           super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         ,*(pointer *)
                           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                           + 8));
      if (_Var4._M_current !=
          *(pointer *)
           ((long)&(psVar1->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
           + 8)) {
        p_Var5 = ((_Var4._M_current)->m_iter)._M_node + 2;
      }
      local_48 = 0;
      local_40 = 0x10;
      __l._M_len = 4;
      __l._M_array = &local_90;
      local_38 = p_Var5;
      std::__cxx11::
      list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::list(&local_b8,__l,(allocator_type *)&local_a0);
      testVirtualEdges(this,&local_b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[+] test non break delete OK!",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      p_Var5 = local_b8.
               super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (local_b8.
          super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
        do {
          p_Var6 = p_Var5->_M_next;
          operator_delete(p_Var5,0x28);
          p_Var5 = p_Var6;
        } while (p_Var6 != (_List_node_base *)&local_b8);
      }
      return;
    }
    __assert_fail("G.getComponent(19)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x9b,"void DynamicGraphTest::testNonBreakDelete()");
  }
  __assert_fail("G.getComponent(11)==4",
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                ,0x93,"void DynamicGraphTest::testNonBreakDelete()");
}

Assistant:

void DynamicGraphTest::testNonBreakDelete()
{
    assert(G.areConnected(16, 17));

    G.deleteEdge(16, 17);
    assert(G.areConnected(16, 17));

    // test levels
    assert(G.getLevel(0)==0);
    assert(G.getLevel(1)==1);
    assert(G.getLevel(2)==1);
    assert(G.getLevel(3)==2);
    assert(G.getLevel(4)==1);
    assert(G.getLevel(5)==2);
    assert(G.getLevel(6)==2);
    assert(G.getLevel(7)==1);
    assert(G.getLevel(8)==2);
    assert(G.getLevel(9)==1);
    assert(G.getLevel(10)==2);
    assert(G.getLevel(11)==2);
    assert(G.getLevel(12)==3);
    assert(G.getLevel(13)==3);
    assert(G.getLevel(14)==4);
    assert(G.getLevel(15)==3);
    assert(G.getLevel(16)==1);
    assert(G.getLevel(17)==4);
    assert(G.getLevel(18)==3);
    assert(G.getLevel(19)==2);

    // test components nothing changes
    assert(G.getComponent(0)==1);
    assert(G.getComponent(1)==1);
    assert(G.getComponent(2)==1);
    assert(G.getComponent(3)==1);
    assert(G.getComponent(4)==2);
    assert(G.getComponent(5)==2);
    assert(G.getComponent(6)==2);
    assert(G.getComponent(9)==4);
    assert(G.getComponent(10)==4);
    assert(G.getComponent(11)==4);
    assert(G.getComponent(12)==4);
    assert(G.getComponent(13)==4);
    assert(G.getComponent(14)==4);
    assert(G.getComponent(15)==4);
    assert(G.getComponent(16)==5);
    assert(G.getComponent(17)==5);
    assert(G.getComponent(18)==5);
    assert(G.getComponent(19)==5);

    // test virtual edges
    std::list<Edge> expectedVirtualEdges = {
            edge(0, 4, G).first,
            edge(0, 7, G).first,
            edge(0, 9, G).first,
            edge(0, 16, G).first,
    };
    testVirtualEdges(expectedVirtualEdges);


    std::cout << "[+] test non break delete OK!" << std::endl;
}